

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::solve_equality
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this)

{
  bool bVar1;
  reference pvVar2;
  float fVar3;
  branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this_local;
  
  fVar3 = compute_lower_bound();
  this->lower_bound = fVar3;
  fVar3 = compute_upper_bound(this);
  this->upper_bound = fVar3;
  make_init_node_0(this);
  pvVar2 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           ::back(&this->nodes);
  if (pvVar2->sumfactor == this->b_min) {
    pvVar2 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
             ::back(&this->nodes);
    this->upper_bound = pvVar2->sumr;
    pvVar2 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
             ::back(&this->nodes);
    shared_subvector::copy
              (&this->subvector,(EVP_PKEY_CTX *)(ulong)pvVar2->variables,
               (EVP_PKEY_CTX *)(ulong)this->solution);
    pvVar2 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
             ::back(&this->nodes);
    shared_subvector::remove(&this->subvector,(char *)(ulong)pvVar2->variables);
  }
  else {
    make_init_node_1(this);
    pvVar2 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
             ::back(&this->nodes);
    if (pvVar2->sumfactor == this->b_min) {
      pvVar2 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
               ::back(&this->nodes);
      this->upper_bound = pvVar2->sumr;
      pvVar2 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
               ::back(&this->nodes);
      shared_subvector::copy
                (&this->subvector,(EVP_PKEY_CTX *)(ulong)pvVar2->variables,
                 (EVP_PKEY_CTX *)(ulong)this->solution);
      pvVar2 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
               ::back(&this->nodes);
      shared_subvector::remove(&this->subvector,(char *)(ulong)pvVar2->variables);
      std::
      vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
      ::pop_back(&this->nodes);
    }
    while (bVar1 = std::
                   vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
                   ::empty(&this->nodes), ((bVar1 ^ 0xffU) & 1) != 0) {
      make_next_equality_node(this);
    }
  }
  return;
}

Assistant:

void solve_equality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (nodes.back().sumfactor == b_min) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
            subvector.remove(nodes.back().variables);
            return;
        }

        make_init_node_1();
        if (nodes.back().sumfactor == b_min) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_equality_node();
    }